

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O0

ktx_pack_astc_quality_levels_e astcQualityLevel(char *quality)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  allocator<char> *in_RDI;
  iterator opt;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
  *in_stack_fffffffffffffe48;
  key_equal *in_stack_fffffffffffffe58;
  hasher *in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe68;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
  *in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  *in_stack_fffffffffffffe80;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
  local_150;
  allocator<char> local_141;
  string local_140 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
  local_120;
  undefined1 local_117 [47];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  size_type local_18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_10;
  
  local_10._M_allocated_capacity = (size_type)in_RDI;
  if (astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_);
    if (iVar2 != 0) {
      local_117._39_8_ = &local_e8;
      local_117._35_4_ = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[8],_ktx_pack_astc_quality_levels_e,_true>
                (in_stack_fffffffffffffe80,(char (*) [8])in_stack_fffffffffffffe78,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffe70);
      local_117._39_8_ = local_c0;
      local_117._15_4_ = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[5],_ktx_pack_astc_quality_levels_e,_true>
                (in_stack_fffffffffffffe80,(char (*) [5])in_stack_fffffffffffffe78,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffe70);
      local_117._39_8_ = local_98;
      local_117._11_4_ = 0x3c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[7],_ktx_pack_astc_quality_levels_e,_true>
                (in_stack_fffffffffffffe80,(char (*) [7])in_stack_fffffffffffffe78,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffe70);
      local_117._39_8_ = local_70;
      local_117._7_4_ = 0x62;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[9],_ktx_pack_astc_quality_levels_e,_true>
                (in_stack_fffffffffffffe80,(char (*) [9])in_stack_fffffffffffffe78,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffe70);
      local_117._39_8_ = local_48;
      local_117._3_4_ = 100;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[11],_ktx_pack_astc_quality_levels_e,_true>
                (in_stack_fffffffffffffe80,(char (*) [11])in_stack_fffffffffffffe78,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffe70);
      local_20 = &local_e8;
      local_18 = 5;
      in_stack_fffffffffffffe48 =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
            *)local_117;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
                   *)0x110d84);
      __l._M_len = (size_type)in_stack_fffffffffffffe80;
      __l._M_array = in_stack_fffffffffffffe78;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
      ::unordered_map(in_stack_fffffffffffffe70,__l,in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                      (allocator_type *)in_stack_fffffffffffffe90);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
                    *)0x110dce);
      local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
      do {
        in_stack_fffffffffffffe90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_160[-2].field_2 + 8);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                 *)0x110df9);
        local_160 = in_stack_fffffffffffffe90;
      } while (in_stack_fffffffffffffe90 != &local_e8);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
                   ::~unordered_map,&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_);
    }
  }
  __s = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,(char *)__s,(allocator<char> *)local_10._M_allocated_capacity
            );
  local_120._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
       ::find(in_stack_fffffffffffffe48,(key_type *)0x110e76);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  local_150._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
       ::end(in_stack_fffffffffffffe48);
  bVar1 = std::__detail::operator!=(&local_120,&local_150);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_false,_true>
                           *)0x110ed7);
    local_10._12_4_ = ppVar3->second;
  }
  else {
    local_10._12_4_ = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
  }
  return local_10._12_4_;
}

Assistant:

ktx_pack_astc_quality_levels_e
astcQualityLevel(const char *quality) {

    static std::unordered_map<std::string,
                              ktx_pack_astc_quality_levels_e> astc_quality_mapping{
        {"fastest", KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST},
        {"fast", KTX_PACK_ASTC_QUALITY_LEVEL_FAST},
        {"medium", KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM},
        {"thorough", KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH},
        {"exhaustive", KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE}
    };

  auto opt = astc_quality_mapping.find(quality);

  if (opt != astc_quality_mapping.end())
      return opt->second;

  return KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
}